

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_TAGGED_POLICY_Unmarshal(TPMS_TAGGED_POLICY *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(&target->handle,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPMT_HA_Unmarshal(&target->policyHash,buffer,size,0);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_TAGGED_POLICY_Unmarshal(TPMS_TAGGED_POLICY *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)&(target->handle), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_HA_Unmarshal((TPMT_HA *)&(target->policyHash), buffer, size, 0);
    return result;
}